

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

int testCore(void)

{
  bool_t bVar1;
  bool_t bVar2;
  bool_t bVar3;
  bool_t bVar4;
  bool_t bVar5;
  bool_t bVar6;
  bool_t bVar7;
  bool_t bVar8;
  bool_t bVar9;
  bool_t bVar10;
  bool_t bVar11;
  bool_t bVar12;
  bool_t bVar13;
  bool_t bVar14;
  bool_t bVar15;
  bool_t bVar16;
  bool_t bVar17;
  bool_t bVar18;
  bool_t bVar19;
  char *pcVar20;
  char *pcVar21;
  
  bVar1 = apduTest();
  pcVar20 = "OK";
  pcVar21 = "OK";
  if (bVar1 == 0) {
    pcVar21 = "Err";
  }
  printf("apduTest: %s\n",pcVar21);
  bVar2 = b64Test();
  pcVar21 = "OK";
  if (bVar2 == 0) {
    pcVar21 = "Err";
  }
  printf("b64Test: %s\n",pcVar21);
  bVar3 = blobTest();
  pcVar21 = "OK";
  if (bVar3 == 0) {
    pcVar21 = "Err";
  }
  printf("blobTest: %s\n",pcVar21);
  bVar4 = decTest();
  pcVar21 = "OK";
  if (bVar4 == 0) {
    pcVar21 = "Err";
  }
  printf("decTest: %s\n",pcVar21);
  bVar5 = derTest();
  pcVar21 = "OK";
  if (bVar5 == 0) {
    pcVar21 = "Err";
  }
  printf("derTest: %s\n",pcVar21);
  bVar6 = fileTest();
  pcVar21 = "OK";
  if (bVar6 == 0) {
    pcVar21 = "Err";
  }
  printf("fileTest: %s\n",pcVar21);
  bVar7 = hexTest();
  pcVar21 = "OK";
  if (bVar7 == 0) {
    pcVar21 = "Err";
  }
  printf("hexTest: %s\n",pcVar21);
  bVar8 = memTest();
  pcVar21 = "OK";
  if (bVar8 == 0) {
    pcVar21 = "Err";
  }
  printf("memTest: %s\n",pcVar21);
  bVar9 = mtTest();
  pcVar21 = "OK";
  if (bVar9 == 0) {
    pcVar21 = "Err";
  }
  printf("mtTest: %s\n",pcVar21);
  bVar10 = objTest();
  pcVar21 = "OK";
  if (bVar10 == 0) {
    pcVar21 = "Err";
  }
  printf("objTest: %s\n",pcVar21);
  bVar11 = oidTest();
  pcVar21 = "OK";
  if (bVar11 == 0) {
    pcVar21 = "Err";
  }
  printf("oidTest: %s\n",pcVar21);
  bVar12 = prngTest();
  pcVar21 = "OK";
  if (bVar12 == 0) {
    pcVar21 = "Err";
  }
  printf("genTest: %s\n",pcVar21);
  bVar13 = rngTest();
  pcVar21 = "OK";
  if (bVar13 == 0) {
    pcVar21 = "Err";
  }
  printf("rngTest: %s\n",pcVar21);
  bVar14 = strTest();
  pcVar21 = "OK";
  if (bVar14 == 0) {
    pcVar21 = "Err";
  }
  printf("strTest: %s\n",pcVar21);
  bVar15 = tmTest();
  pcVar21 = "OK";
  if (bVar15 == 0) {
    pcVar21 = "Err";
  }
  printf("tmTest: %s\n",pcVar21);
  bVar16 = u16Test();
  pcVar21 = "OK";
  if (bVar16 == 0) {
    pcVar21 = "Err";
  }
  printf("u16Test: %s\n",pcVar21);
  bVar17 = u32Test();
  pcVar21 = "OK";
  if (bVar17 == 0) {
    pcVar21 = "Err";
  }
  printf("u32Test: %s\n",pcVar21);
  bVar18 = u64Test();
  pcVar21 = "OK";
  if (bVar18 == 0) {
    pcVar21 = "Err";
  }
  printf("u64Test: %s\n",pcVar21);
  bVar19 = utilTest();
  if (bVar19 == 0) {
    pcVar20 = "Err";
  }
  printf("utilTest: %s\n",pcVar20);
  return (uint)((bVar19 == 0 || (bVar18 == 0 || bVar17 == 0)) ||
               ((bVar16 == 0 || (bVar15 == 0 || (bVar14 == 0 || (bVar13 == 0 || bVar12 == 0)))) ||
               ((bVar11 == 0 || (bVar10 == 0 || (bVar9 == 0 || bVar8 == 0))) ||
               ((bVar7 == 0 || (bVar6 == 0 || bVar5 == 0)) ||
               ((bVar4 == 0 || bVar3 == 0) || (bVar2 == 0 || bVar1 == 0))))));
}

Assistant:

int testCore()
{
	bool_t code;
	int ret = 0;
	printf("apduTest: %s\n", (code = apduTest()) ? "OK" : "Err"), ret |= !code;
	printf("b64Test: %s\n", (code = b64Test()) ? "OK" : "Err"), ret |= !code;
	printf("blobTest: %s\n", (code = blobTest()) ? "OK" : "Err"), ret |= !code;
	printf("decTest: %s\n", (code = decTest()) ? "OK" : "Err"), ret |= !code;
	printf("derTest: %s\n", (code = derTest()) ? "OK" : "Err"), ret |= !code;
	printf("fileTest: %s\n", (code = fileTest()) ? "OK" : "Err"), ret |= !code;
	printf("hexTest: %s\n", (code = hexTest()) ? "OK" : "Err"), ret |= !code;
	printf("memTest: %s\n", (code = memTest()) ? "OK" : "Err"), ret |= !code;
	printf("mtTest: %s\n", (code = mtTest()) ? "OK" : "Err"), ret |= !code;
	printf("objTest: %s\n", (code = objTest()) ? "OK" : "Err"), ret |= !code;
	printf("oidTest: %s\n", (code = oidTest()) ? "OK" : "Err"), ret |= !code;
	printf("genTest: %s\n", (code = prngTest()) ? "OK" : "Err"), ret |= !code;
	printf("rngTest: %s\n", (code = rngTest()) ? "OK" : "Err"), ret |= !code;
	printf("strTest: %s\n", (code = strTest()) ? "OK" : "Err"), ret |= !code;
	printf("tmTest: %s\n", (code = tmTest()) ? "OK" : "Err"), ret |= !code;
	printf("u16Test: %s\n", (code = u16Test()) ? "OK" : "Err"), ret |= !code;
	printf("u32Test: %s\n", (code = u32Test()) ? "OK" : "Err"), ret |= !code;
	printf("u64Test: %s\n", (code = u64Test()) ? "OK" : "Err"), ret |= !code;
	printf("utilTest: %s\n", (code = utilTest()) ? "OK" : "Err"), ret |= !code;
	return ret;
}